

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::encodeISEQuintBlock
               (BitAssignAccessStream *dst,int numBits,bool fromExplicitInputBlock,Block *blockInput
               ,deUint32 *nonBlockInput,int numValues)

{
  deUint32 dVar1;
  deUint32 local_54;
  deUint32 local_50;
  int local_48;
  deUint32 Q;
  int i;
  deUint32 bitParts [3];
  deUint32 quintParts [3];
  int numValues_local;
  deUint32 *nonBlockInput_local;
  Block *blockInput_local;
  bool fromExplicitInputBlock_local;
  int numBits_local;
  BitAssignAccessStream *dst_local;
  
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    if (local_48 < numValues) {
      if (fromExplicitInputBlock) {
        (&Q)[local_48] = blockInput->bitValues[local_48];
        bitParts[(long)local_48 + 1] = 0xffffffff;
      }
      else {
        if (numBits < 1) {
          local_50 = 0;
        }
        else {
          local_50 = getBits(nonBlockInput[local_48],0,numBits + -1);
        }
        (&Q)[local_48] = local_50;
        bitParts[(long)local_48 + 1] = nonBlockInput[local_48] >> ((byte)numBits & 0x1f);
      }
    }
    else {
      (&Q)[local_48] = 0;
      bitParts[(long)local_48 + 1] = 0;
    }
  }
  if (fromExplicitInputBlock) {
    local_54 = blockInput->tOrQValue;
  }
  else {
    local_54 = encodeISEQuintBlock::quintBlockQValue[bitParts[1]][bitParts[2]][quintParts[0]];
  }
  BitAssignAccessStream::setNext(dst,numBits,Q);
  dVar1 = getBits(local_54,0,2);
  BitAssignAccessStream::setNext(dst,3,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,i);
  dVar1 = getBits(local_54,3,4);
  BitAssignAccessStream::setNext(dst,2,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,bitParts[0]);
  dVar1 = getBits(local_54,5,6);
  BitAssignAccessStream::setNext(dst,2,dVar1);
  return;
}

Assistant:

static void encodeISEQuintBlock (BitAssignAccessStream& dst, int numBits, bool fromExplicitInputBlock, const ISEInput::Block& blockInput, const deUint32* nonBlockInput, int numValues)
{
	// quintBlockQValue[q0][q1][q2] is a value of Q (not necessarily the only one) that will yield the given quints when decoded.
	static const deUint32 quintBlockQValue[5][5][5] =
	{
		{{0, 32, 64, 96, 102}, {8, 40, 72, 104, 110}, {16, 48, 80, 112, 118}, {24, 56, 88, 120, 126}, {5, 37, 69, 101, 39}},
		{{1, 33, 65, 97, 103}, {9, 41, 73, 105, 111}, {17, 49, 81, 113, 119}, {25, 57, 89, 121, 127}, {13, 45, 77, 109, 47}},
		{{2, 34, 66, 98, 70}, {10, 42, 74, 106, 78}, {18, 50, 82, 114, 86}, {26, 58, 90, 122, 94}, {21, 53, 85, 117, 55}},
		{{3, 35, 67, 99, 71}, {11, 43, 75, 107, 79}, {19, 51, 83, 115, 87}, {27, 59, 91, 123, 95}, {29, 61, 93, 125, 63}},
		{{4, 36, 68, 100, 38}, {12, 44, 76, 108, 46}, {20, 52, 84, 116, 54}, {28, 60, 92, 124, 62}, {6, 14, 22, 30, 7}}
	};

	DE_ASSERT(de::inRange(numValues, 1, 3));

	deUint32 quintParts[3];
	deUint32 bitParts[3];

	for (int i = 0; i < 3; i++)
	{
		if (i < numValues)
		{
			if (fromExplicitInputBlock)
			{
				bitParts[i]		= blockInput.bitValues[i];
				quintParts[i]	= -1; // \note Won't be used, but silences warning.
			}
			else
			{
				// \todo [2016-01-20 pyry] numBits = 0 doesn't make sense
				bitParts[i]		= numBits > 0 ? getBits(nonBlockInput[i], 0, numBits-1) : 0;
				quintParts[i]	= nonBlockInput[i] >> numBits;
			}
		}
		else
		{
			bitParts[i]		= 0;
			quintParts[i]	= 0;
		}
	}

	const deUint32 Q = fromExplicitInputBlock ? blockInput.tOrQValue : quintBlockQValue[quintParts[0]]
																					   [quintParts[1]]
																					   [quintParts[2]];

	dst.setNext(numBits,	bitParts[0]);
	dst.setNext(3,			getBits(Q, 0, 2));
	dst.setNext(numBits,	bitParts[1]);
	dst.setNext(2,			getBits(Q, 3, 4));
	dst.setNext(numBits,	bitParts[2]);
	dst.setNext(2,			getBits(Q, 5, 6));
}